

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O2

void __thiscall btGeneric6DofConstraint::calcAnchorPos(btGeneric6DofConstraint *this)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar5;
  undefined4 uVar6;
  btVector3 bVar7;
  btScalar weight;
  float local_40;
  float local_3c;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  fVar1 = ((this->super_btTypedConstraint).m_rbA)->m_inverseMass;
  fVar2 = ((this->super_btTypedConstraint).m_rbB)->m_inverseMass;
  uVar4 = -(uint)(fVar2 == 0.0);
  uVar5 = 0;
  uVar6 = 0;
  local_3c = (float)(uVar4 & 0x3f800000 | ~uVar4 & (uint)(fVar1 / (fVar1 + fVar2)));
  bVar7 = operator*(&(this->m_calculatedTransformA).m_origin,&local_3c);
  local_38._8_4_ = extraout_XMM0_Dc;
  local_38._0_8_ = bVar7.m_floats._0_8_;
  local_38._12_4_ = extraout_XMM0_Dd;
  local_28._8_4_ = uVar5;
  local_28._0_8_ = bVar7.m_floats._8_8_;
  local_28._12_4_ = uVar6;
  local_40 = 1.0 - local_3c;
  bVar7 = operator*(&(this->m_calculatedTransformB).m_origin,&local_40);
  auVar3._4_4_ = bVar7.m_floats[1] + (float)local_38._4_4_;
  auVar3._0_4_ = bVar7.m_floats[0] + (float)local_38._0_4_;
  auVar3._8_4_ = bVar7.m_floats[2] + (float)local_28._0_4_;
  auVar3._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_AnchorPos).m_floats = auVar3;
  return;
}

Assistant:

void btGeneric6DofConstraint::calcAnchorPos(void)
{
	btScalar imA = m_rbA.getInvMass();
	btScalar imB = m_rbB.getInvMass();
	btScalar weight;
	if(imB == btScalar(0.0))
	{
		weight = btScalar(1.0);
	}
	else
	{
		weight = imA / (imA + imB);
	}
	const btVector3& pA = m_calculatedTransformA.getOrigin();
	const btVector3& pB = m_calculatedTransformB.getOrigin();
	m_AnchorPos = pA * weight + pB * (btScalar(1.0) - weight);
	return;
}